

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

void __thiscall wasm::Precompute::considerPartiallyPrecomputing(Precompute *this,Expression *curr)

{
  bool bVar1;
  Module *wasm_00;
  Function *pFVar2;
  Module *wasm;
  Select *select;
  Expression *curr_local;
  Precompute *this_local;
  
  if (((this->canPartiallyPrecompute & 1U) != 0) &&
     (select = (Select *)curr, curr_local = (Expression *)this,
     wasm = (Module *)Expression::dynCast<wasm::Select>(curr), wasm != (Module *)0x0)) {
    wasm_00 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>::
              getModule(&(this->
                         super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                         ).
                         super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                         .
                         super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                       );
    bVar1 = Properties::isValidConstantExpression
                      (wasm_00,(Expression *)
                               (wasm->exports).
                               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((bVar1) &&
       ((bVar1 = Properties::isValidConstantExpression
                           (wasm_00,(Expression *)
                                    (wasm->functions).
                                    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start), bVar1 &&
        (pFVar2 = Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                  ::getFunction(&(this->
                                 super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                 .
                                 super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                               ), (Module *)pFVar2->body != wasm)))) {
      std::
      unordered_set<wasm::Select_*,_std::hash<wasm::Select_*>,_std::equal_to<wasm::Select_*>,_std::allocator<wasm::Select_*>_>
      ::insert(&this->partiallyPrecomputable,(value_type *)&wasm);
    }
  }
  return;
}

Assistant:

void considerPartiallyPrecomputing(Expression* curr) {
    if (!canPartiallyPrecompute) {
      return;
    }

    if (auto* select = curr->dynCast<Select>()) {
      // We only have a reasonable hope of success if the select arms are things
      // like constants or global gets. At a first approximation, allow the set
      // of things we allow in constant initializers (but we can probably allow
      // more here TODO).
      //
      // We also ignore selects with no parent (that are the entire function
      // body) as then there is nothing to optimize into their arms.
      auto& wasm = *getModule();
      if (Properties::isValidConstantExpression(wasm, select->ifTrue) &&
          Properties::isValidConstantExpression(wasm, select->ifFalse) &&
          getFunction()->body != select) {
        partiallyPrecomputable.insert(select);
      }
    }
  }